

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_coding.h
# Opt level: O0

uint16_t float_to_half(float fv)

{
  imath_half_bits_t iVar1;
  float in_XMM0_Da;
  
  iVar1 = imath_float_to_half(in_XMM0_Da);
  return iVar1;
}

Assistant:

static inline uint16_t
float_to_half (float fv)
{
#ifdef IMATH_HALF_SAFE_FOR_C
    return imath_float_to_half (fv);
#else
    union
    {
        uint32_t i;
        float    f;
    } v;
    uint16_t ret;
    uint32_t e, m, ui, r, shift;

    v.f = fv;
    ui  = (v.i & ~0x80000000);
    ret = ((v.i >> 16) & 0x8000);

    if (ui >= 0x38800000)
    {
        if (OUR_UNLIKELY (ui >= 0x7f800000))
        {
            ret |= 0x7c00;
            if (ui == 0x7f800000) return ret;
            m = (ui & 0x7fffff) >> 13;
            return (uint16_t) (ret | m | (m == 0));
        }

        if (OUR_UNLIKELY (ui > 0x477fefff)) return ret | 0x7c00;

        ui -= 0x38000000;
        ui = ((ui + 0x00000fff + ((ui >> 13) & 1)) >> 13);
        return (uint16_t) (ret | ui);
    }

    // zero or flush to 0
    if (ui < 0x33000001) return ret;

    // produce a denormalized half
    e     = (ui >> 23);
    shift = 0x7e - e;
    m     = 0x800000 | (ui & 0x7fffff);
    r     = m << (32 - shift);
    ret |= (m >> shift);
    if (r > 0x80000000 || (r == 0x80000000 && (ret & 0x1) != 0)) ++ret;
    return ret;
#endif
}